

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmaster.c
# Opt level: O0

void prepare_for_output_pass(j_decompress_ptr cinfo)

{
  long lVar1;
  int iVar2;
  undefined8 uVar3;
  long *in_RDI;
  my_master_ptr master;
  
  lVar1 = in_RDI[0x44];
  if (*(int *)(lVar1 + 0x10) == 0) {
    if ((*(int *)((long)in_RDI + 0x6c) != 0) && (in_RDI[0x14] == 0)) {
      if ((*(int *)((long)in_RDI + 0x74) == 0) || (*(int *)((long)in_RDI + 0x84) == 0)) {
        if (*(int *)((long)in_RDI + 0x7c) == 0) {
          *(undefined4 *)(*in_RDI + 0x28) = 0x2e;
          (**(code **)*in_RDI)(in_RDI);
        }
        else {
          in_RDI[0x4e] = *(long *)(lVar1 + 0x80);
        }
      }
      else {
        in_RDI[0x4e] = *(long *)(lVar1 + 0x88);
        *(undefined4 *)(lVar1 + 0x10) = 1;
      }
    }
    (**(code **)in_RDI[0x4b])(in_RDI);
    (**(code **)(in_RDI[0x46] + 0x10))(in_RDI);
    if (*(int *)((long)in_RDI + 0x5c) == 0) {
      if (*(int *)(lVar1 + 0x7c) == 0) {
        (**(code **)in_RDI[0x4d])(in_RDI);
      }
      (**(code **)in_RDI[0x4c])(in_RDI);
      if (*(int *)((long)in_RDI + 0x6c) != 0) {
        (**(code **)in_RDI[0x4e])(in_RDI,*(undefined4 *)(lVar1 + 0x10));
      }
      uVar3 = 0;
      if (*(int *)(lVar1 + 0x10) != 0) {
        uVar3 = 3;
      }
      (**(code **)in_RDI[0x47])(in_RDI,uVar3);
      (**(code **)in_RDI[0x45])(in_RDI,0);
    }
  }
  else {
    *(undefined4 *)(lVar1 + 0x10) = 0;
    (**(code **)in_RDI[0x4e])(in_RDI,0);
    (**(code **)in_RDI[0x47])(in_RDI,2);
    (**(code **)in_RDI[0x45])(in_RDI,2);
  }
  if (in_RDI[2] != 0) {
    *(undefined4 *)(in_RDI[2] + 0x18) = *(undefined4 *)(lVar1 + 0x78);
    iVar2 = 1;
    if (*(int *)(lVar1 + 0x10) != 0) {
      iVar2 = 2;
    }
    *(int *)(in_RDI[2] + 0x1c) = *(int *)(lVar1 + 0x78) + iVar2;
    if (((int)in_RDI[0xb] != 0) && (*(int *)(in_RDI[0x48] + 0x24) == 0)) {
      iVar2 = 1;
      if (*(int *)((long)in_RDI + 0x84) != 0) {
        iVar2 = 2;
      }
      *(int *)(in_RDI[2] + 0x1c) = iVar2 + *(int *)(in_RDI[2] + 0x1c);
    }
  }
  return;
}

Assistant:

METHODDEF(void)
prepare_for_output_pass(j_decompress_ptr cinfo)
{
  my_master_ptr master = (my_master_ptr)cinfo->master;

  if (master->pub.is_dummy_pass) {
#ifdef QUANT_2PASS_SUPPORTED
    /* Final pass of 2-pass quantization */
    master->pub.is_dummy_pass = FALSE;
    (*cinfo->cquantize->start_pass) (cinfo, FALSE);
    (*cinfo->post->start_pass) (cinfo, JBUF_CRANK_DEST);
    (*cinfo->main->start_pass) (cinfo, JBUF_CRANK_DEST);
#else
    ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif /* QUANT_2PASS_SUPPORTED */
  } else {
    if (cinfo->quantize_colors && cinfo->colormap == NULL) {
      /* Select new quantization method */
      if (cinfo->two_pass_quantize && cinfo->enable_2pass_quant) {
        cinfo->cquantize = master->quantizer_2pass;
        master->pub.is_dummy_pass = TRUE;
      } else if (cinfo->enable_1pass_quant) {
        cinfo->cquantize = master->quantizer_1pass;
      } else {
        ERREXIT(cinfo, JERR_MODE_CHANGE);
      }
    }
    (*cinfo->idct->start_pass) (cinfo);
    (*cinfo->coef->start_output_pass) (cinfo);
    if (!cinfo->raw_data_out) {
      if (!master->using_merged_upsample)
        (*cinfo->cconvert->start_pass) (cinfo);
      (*cinfo->upsample->start_pass) (cinfo);
      if (cinfo->quantize_colors)
        (*cinfo->cquantize->start_pass) (cinfo, master->pub.is_dummy_pass);
      (*cinfo->post->start_pass) (cinfo,
            (master->pub.is_dummy_pass ? JBUF_SAVE_AND_PASS : JBUF_PASS_THRU));
      (*cinfo->main->start_pass) (cinfo, JBUF_PASS_THRU);
    }
  }

  /* Set up progress monitor's pass info if present */
  if (cinfo->progress != NULL) {
    cinfo->progress->completed_passes = master->pass_number;
    cinfo->progress->total_passes = master->pass_number +
                                    (master->pub.is_dummy_pass ? 2 : 1);
    /* In buffered-image mode, we assume one more output pass if EOI not
     * yet reached, but no more passes if EOI has been reached.
     */
    if (cinfo->buffered_image && !cinfo->inputctl->eoi_reached) {
      cinfo->progress->total_passes += (cinfo->enable_2pass_quant ? 2 : 1);
    }
  }
}